

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bltrimws(bstring b)

{
  int iVar1;
  ushort **ppuVar2;
  int local_1c;
  int len;
  int i;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->mlen < b->slen)) ||
     ((b->slen < 0 || (b->mlen < 1)))) {
    b_local._4_4_ = -1;
  }
  else {
    iVar1 = b->slen;
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(uint)b->data[local_1c]] & 0x2000) == 0) {
        iVar1 = bdelete(b,0,local_1c);
        return iVar1;
      }
    }
    *b->data = '\0';
    b->slen = 0;
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int bltrimws (bstring b) {
int i, len;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (len = b->slen, i = 0; i < len; i++) {
		if (!wspace (b->data[i])) {
			return bdelete (b, 0, i);
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return BSTR_OK;
}